

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.h
# Opt level: O0

void __thiscall CChromeTracer::~CChromeTracer(CChromeTracer *this)

{
  ostream *poVar1;
  ostream *poVar2;
  long in_RDI;
  CChromeTracer *in_stack_ffffffffffffffd0;
  
  flush(in_stack_ffffffffffffffd0);
  poVar1 = std::operator<<((ostream *)(in_RDI + 0x40),
                           "{\"ph\":\"M\",\"name\":\"clintercept_eof\",\"pid\":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0x30));
  poVar2 = std::operator<<(poVar1,",\"tid\":0");
  poVar2 = std::operator<<(poVar2,"}\n");
  std::operator<<(poVar2,"]\n");
  std::ofstream::close();
  std::vector<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_>::~vector
            ((vector<CChromeTracer::Record,_std::allocator<CChromeTracer::Record>_> *)poVar1);
  std::ofstream::~ofstream((void *)(in_RDI + 0x40));
  return;
}

Assistant:

~CChromeTracer()
    {
        flush();

        // Add an eof metadata event without a trailing comma to properly end
        // the json file.
        m_TraceFile
            << "{\"ph\":\"M\",\"name\":\"clintercept_eof\",\"pid\":" << m_ProcessId
            << ",\"tid\":0"
            << "}\n"
            << "]\n";
        m_TraceFile.close();
    }